

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::CollationRuleParser
          (CollationRuleParser *this,CollationData *base,UErrorCode *errorCode)

{
  Normalizer2 *pNVar1;
  UErrorCode *errorCode_local;
  CollationData *base_local;
  CollationRuleParser *this_local;
  
  pNVar1 = Normalizer2::getNFDInstance(errorCode);
  this->nfd = pNVar1;
  pNVar1 = Normalizer2::getNFCInstance(errorCode);
  this->nfc = pNVar1;
  this->rules = (UnicodeString *)0x0;
  this->baseData = base;
  this->settings = (CollationSettings *)0x0;
  this->parseError = (UParseError *)0x0;
  this->errorReason = (char *)0x0;
  this->sink = (Sink *)0x0;
  this->importer = (Importer *)0x0;
  this->ruleIndex = 0;
  return;
}

Assistant:

CollationRuleParser::CollationRuleParser(const CollationData *base, UErrorCode &errorCode)
        : nfd(*Normalizer2::getNFDInstance(errorCode)),
          nfc(*Normalizer2::getNFCInstance(errorCode)),
          rules(NULL), baseData(base), settings(NULL),
          parseError(NULL), errorReason(NULL),
          sink(NULL), importer(NULL),
          ruleIndex(0) {
}